

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

RegEx * YAML::Exp::ChompIndicator(void)

{
  int iVar1;
  allocator local_29;
  string local_28;
  
  if (ChompIndicator()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&ChompIndicator()::e);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&local_28,"+-",&local_29);
      RegEx::RegEx(&ChompIndicator::e,&local_28,REGEX_OR);
      std::__cxx11::string::~string((string *)&local_28);
      __cxa_atexit(RegEx::~RegEx,&ChompIndicator::e,&__dso_handle);
      __cxa_guard_release(&ChompIndicator()::e);
    }
  }
  return &ChompIndicator::e;
}

Assistant:

inline const RegEx& ChompIndicator() {
  static const RegEx e = RegEx("+-", REGEX_OR);
  return e;
}